

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pdist.c
# Opt level: O0

double chipdf(double x,int df)

{
  double dVar1;
  double k;
  double oup;
  int df_local;
  double x_local;
  
  if (df < 1) {
    printf("Degree of freedom is a real positive integer");
    exit(1);
  }
  if (x < 0.0) {
    printf("The range of distribution only takes non-negative and real values");
    exit(1);
  }
  dVar1 = gammapdf(x,(double)df / 2.0,2.0);
  return dVar1;
}

Assistant:

double chipdf(double x, int df) {
	double oup,k;
	if (df <= 0 ) {
		printf("Degree of freedom is a real positive integer");
		exit(1);
	}
	
	if (x < 0.) {
		printf("The range of distribution only takes non-negative and real values");
		exit(1);
	}
	
	k = (double) df;
	oup = gammapdf(x,k/2,2.);
	
	return oup;
}